

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

_Bool cpu_physical_memory_is_io_aarch64(AddressSpace *as,hwaddr phys_addr)

{
  MemoryRegion *pMVar1;
  hwaddr l;
  hwaddr local_10;
  hwaddr local_8;
  
  local_10 = 1;
  local_8 = phys_addr;
  pMVar1 = flatview_translate_aarch64
                     ((uc_struct_conflict2 *)as,as->current_map,phys_addr,&local_8,&local_10,false,
                      (MemTxAttrs)0x1);
  return (_Bool)(pMVar1->ram ^ 1);
}

Assistant:

bool cpu_physical_memory_is_io(AddressSpace *as, hwaddr phys_addr)
{
    MemoryRegion*mr;
    hwaddr l = 1;
    bool res;

    mr = address_space_translate(as,
                                 phys_addr, &phys_addr, &l, false,
                                 MEMTXATTRS_UNSPECIFIED);

    res = !memory_region_is_ram(mr);
    return res;
}